

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::setSelection(QTreeView *this,QRect *rect,SelectionFlags command)

{
  QTreeViewPrivate *this_00;
  QTreeViewItem *pQVar1;
  QHeaderView *this_01;
  long lVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  int iVar5;
  QItemSelectionModel *pQVar6;
  uint *puVar7;
  ulong uVar8;
  fd_set *in_R8;
  timeval *in_R9;
  long in_FS_OFFSET;
  QModelIndex local_c0;
  QModelIndex local_a8;
  uint local_88;
  uint uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  QAbstractItemModel *local_78;
  uint local_68;
  int iStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QAbstractItemModel *local_58;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if ((pQVar6 != (QItemSelectionModel *)0x0) && (bVar4 = QRect::isNull(rect), !bVar4)) {
    QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
    bVar4 = QWidget::isRightToLeft((QWidget *)this);
    local_68 = (rect->x1).m_i;
    if (bVar4) {
      local_88 = (rect->x2).m_i;
      puVar7 = &local_68;
      if ((int)local_68 < (int)local_88) {
        puVar7 = &local_88;
      }
    }
    else {
      local_88 = (rect->x2).m_i;
      puVar7 = &local_88;
      if ((int)local_68 < (int)local_88) {
        puVar7 = &local_68;
      }
    }
    local_40 = *puVar7;
    iVar5 = (rect->y1).m_i;
    local_3c = (rect->y2).m_i;
    if (iVar5 < local_3c) {
      local_3c = iVar5;
    }
    bVar4 = QWidget::isRightToLeft((QWidget *)this);
    local_68 = (rect->x1).m_i;
    if (bVar4) {
      local_88 = (rect->x2).m_i;
      puVar7 = &local_88;
      if ((int)local_68 < (int)local_88) {
        puVar7 = &local_68;
      }
    }
    else {
      local_88 = (rect->x2).m_i;
      puVar7 = &local_68;
      if ((int)local_68 < (int)local_88) {
        puVar7 = &local_88;
      }
    }
    local_48 = *puVar7;
    iVar5 = (rect->y1).m_i;
    local_44 = (rect->y2).m_i;
    if (local_44 < iVar5) {
      local_44 = iVar5;
    }
    local_58 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = 0xaaaaaaaa;
    iStack_64 = -0x55555556;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))(&local_68,this,&local_40);
    local_78 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaa;
    uStack_84 = 0xaaaaaaaa;
    uStack_80 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))(&local_88,this,&local_48);
    if ((((int)local_68 < 0) || (iStack_64 < 0)) || (local_58 == (QAbstractItemModel *)0x0)) {
      if ((int)(local_88 | uStack_84) < 0 || local_78 == (QAbstractItemModel *)0x0) {
        if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                   super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 1) != 0) {
          pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
          (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6);
        }
        goto LAB_00545dce;
      }
      if ((this_00->viewItems).d.size != 0) {
        pQVar1 = (this_00->viewItems).d.ptr;
        local_58 = (pQVar1->index).m.ptr;
        local_68 = (pQVar1->index).r;
        iStack_64 = (pQVar1->index).c;
        uStack_60 = (undefined4)(pQVar1->index).i;
        uStack_5c = *(undefined4 *)((long)&(pQVar1->index).i + 4);
      }
    }
    if (((int)(local_88 | uStack_84) < 0 || local_78 == (QAbstractItemModel *)0x0) &&
       ((this_00->viewItems).d.size != 0)) {
      this_01 = this_00->header;
      iVar5 = QHeaderView::count(this_01);
      iVar5 = QHeaderView::logicalIndex(this_01,iVar5 + -1);
      pQVar1 = (this_00->viewItems).d.ptr;
      lVar2 = (this_00->viewItems).d.size;
      local_a8.m.ptr = pQVar1[lVar2 + -1].index.m.ptr;
      pQVar1 = pQVar1 + lVar2 + -1;
      local_a8.r = (pQVar1->index).r;
      local_a8.c = (pQVar1->index).c;
      local_a8.i = (pQVar1->index).i;
      QModelIndex::sibling(&local_c0,&local_a8,local_a8.r,iVar5);
      local_78 = local_c0.m.ptr;
      local_88 = local_c0.r;
      uStack_84 = local_c0.c;
      uStack_80 = (undefined4)local_c0.i;
      uStack_7c = local_c0.i._4_4_;
    }
    pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
    uVar8 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,&local_68);
    if (((uVar8 & 0x20) != 0) &&
       (pQVar3 = (this_00->super_QAbstractItemViewPrivate).model,
       uVar8 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,&local_88), (uVar8 & 0x20) != 0)) {
      QTreeViewPrivate::select
                (this_00,(int)&local_68,(fd_set *)&local_88,
                 (fd_set *)
                 (ulong)(uint)command.
                              super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                              super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i,in_R8,in_R9)
      ;
    }
  }
LAB_00545dce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTreeView);
    if (!selectionModel() || rect.isNull())
        return;

    d->executePostedLayout();
    QPoint tl(isRightToLeft() ? qMax(rect.left(), rect.right())
              : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom()));
    QPoint br(isRightToLeft() ? qMin(rect.left(), rect.right()) :
              qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom()));
    QModelIndex topLeft = indexAt(tl);
    QModelIndex bottomRight = indexAt(br);
    if (!topLeft.isValid() && !bottomRight.isValid()) {
        if (command & QItemSelectionModel::Clear)
            selectionModel()->clear();
        return;
    }
    if (!topLeft.isValid() && !d->viewItems.isEmpty())
        topLeft = d->viewItems.constFirst().index;
    if (!bottomRight.isValid() && !d->viewItems.isEmpty()) {
        const int column = d->header->logicalIndex(d->header->count() - 1);
        const QModelIndex index = d->viewItems.constLast().index;
        bottomRight = index.sibling(index.row(), column);
    }

    if (!d->isIndexEnabled(topLeft) || !d->isIndexEnabled(bottomRight))
        return;

    d->select(topLeft, bottomRight, command);
}